

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImDrawList **ppIVar4;
  ImDrawCmd *pIVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar3 = this->CmdListsCount;
  if (0 < (long)iVar3) {
    ppIVar4 = this->CmdLists;
    lVar6 = 0;
    do {
      lVar7 = (long)(ppIVar4[lVar6]->CmdBuffer).Size;
      if (0 < lVar7) {
        pIVar5 = (ppIVar4[lVar6]->CmdBuffer).Data;
        lVar8 = 0;
        do {
          fVar1 = fb_scale->x;
          fVar2 = fb_scale->y;
          *(float *)((long)&(pIVar5->ClipRect).x + lVar8) =
               *(float *)((long)&(pIVar5->ClipRect).x + lVar8) * fVar1;
          *(float *)((long)&(pIVar5->ClipRect).y + lVar8) =
               *(float *)((long)&(pIVar5->ClipRect).y + lVar8) * fVar2;
          *(float *)((long)&(pIVar5->ClipRect).z + lVar8) =
               fVar1 * *(float *)((long)&(pIVar5->ClipRect).z + lVar8);
          *(float *)((long)&(pIVar5->ClipRect).w + lVar8) =
               fVar2 * *(float *)((long)&(pIVar5->ClipRect).w + lVar8);
          lVar8 = lVar8 + 0x38;
        } while (lVar7 * 0x38 - lVar8 != 0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar3);
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}